

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

bool __thiscall
duckdb::DictionaryCompressionCompressState::CalculateSpaceRequirements
          (DictionaryCompressionCompressState *this,bool new_string,idx_t string_size)

{
  __int_type _Var1;
  bitpacking_width_t bVar2;
  pointer pCVar3;
  idx_t iVar4;
  undefined7 in_register_00000031;
  idx_t index_count;
  idx_t iVar5;
  
  if ((int)CONCAT71(in_register_00000031,new_string) == 0) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var1 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    index_count = (long)(this->index_buffer).
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->index_buffer).
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
    iVar5 = (idx_t)(this->current_dictionary).size;
    bVar2 = this->current_width;
    iVar4 = CompressionInfo::GetBlockSize
                      (&(this->super_DictionaryCompressionState).super_CompressionState.info);
  }
  else {
    bVar2 = BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>
                      ((long)(this->index_buffer).
                             super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(this->index_buffer).
                             super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2);
    this->next_width = bVar2;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var1 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    index_count = ((long)(this->index_buffer).
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->index_buffer).
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) + 1;
    iVar5 = (this->current_dictionary).size + string_size;
    bVar2 = this->next_width;
    iVar4 = CompressionInfo::GetBlockSize
                      (&(this->super_DictionaryCompressionState).super_CompressionState.info);
  }
  iVar5 = DictionaryCompression::RequiredSpace(_Var1 + 1,index_count,iVar5,bVar2);
  return iVar5 <= iVar4;
}

Assistant:

bool DictionaryCompressionCompressState::CalculateSpaceRequirements(bool new_string, idx_t string_size) {
	if (!new_string) {
		return DictionaryCompression::HasEnoughSpace(current_segment->count.load() + 1, index_buffer.size(),
		                                             current_dictionary.size, current_width, info.GetBlockSize());
	}
	next_width = BitpackingPrimitives::MinimumBitWidth(index_buffer.size() - 1 + new_string);
	return DictionaryCompression::HasEnoughSpace(current_segment->count.load() + 1, index_buffer.size() + 1,
	                                             current_dictionary.size + string_size, next_width,
	                                             info.GetBlockSize());
}